

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_anydata(lyout *out,int level,lys_node *node)

{
  char *pcVar1;
  lys_node_anydata *any;
  int flag;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  any._0_4_ = 0;
  pcVar1 = "anydata";
  if (node->nodetype == LYS_ANYXML) {
    pcVar1 = "anyxml";
  }
  _flag = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  ly_print(out,"%*s%s %s",(ulong)(uint)(level << 1),"",pcVar1,node->name);
  node_local._4_4_ = node_local._4_4_ + 1;
  yang_print_snode_common(plStack_10,node_local._4_4_,_flag,_flag->module,(int *)&any,1);
  if (node[1].name != (char *)0x0) {
    yang_print_open(plStack_10,(int *)&any);
    yang_print_when(plStack_10,node_local._4_4_,_flag->module,(lys_when *)node[1].name);
  }
  for (any._4_4_ = 0; any._4_4_ < (int)(uint)node->iffeature_size; any._4_4_ = any._4_4_ + 1) {
    yang_print_open(plStack_10,(int *)&any);
    yang_print_iffeature(plStack_10,node_local._4_4_,_flag->module,node->iffeature + any._4_4_);
  }
  for (any._4_4_ = 0; any._4_4_ < (int)(uint)node->padding[3]; any._4_4_ = any._4_4_ + 1) {
    yang_print_open(plStack_10,(int *)&any);
    yang_print_must(plStack_10,node_local._4_4_,_flag->module,
                    (lys_restr *)(node[1].dsc + (long)any._4_4_ * 0x38));
  }
  yang_print_snode_common(plStack_10,node_local._4_4_,_flag,_flag->module,(int *)&any,0x7c);
  node_local._4_4_ = node_local._4_4_ + -1;
  yang_print_close(plStack_10,node_local._4_4_,(int)any);
  return;
}

Assistant:

static void
yang_print_anydata(struct lyout *out, int level, const struct lys_node *node)
{
    int i, flag = 0;
    struct lys_node_anydata *any = (struct lys_node_anydata *)node;

    ly_print(out, "%*s%s %s", LEVEL, INDENT, any->nodetype == LYS_ANYXML ? "anyxml" : "anydata", any->name);
    level++;

    yang_print_snode_common(out, level, node, node->module, &flag, SNODE_COMMON_EXT);
    if (any->when) {
        yang_print_open(out, &flag);
        yang_print_when(out, level, node->module, any->when);
    }
    for (i = 0; i < any->iffeature_size; i++) {
        yang_print_open(out, &flag);
        yang_print_iffeature(out, level, node->module, &any->iffeature[i]);
    }
    for (i = 0; i < any->must_size; i++) {
        yang_print_open(out, &flag);
        yang_print_must(out, level, node->module, &any->must[i]);
    }
    yang_print_snode_common(out, level, node, node->module, &flag, SNODE_COMMON_CONFIG | SNODE_COMMON_MAND |
                            SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
    level--;
    yang_print_close(out, level, flag);
}